

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

char * __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  bool bVar1;
  char *pcVar2;
  string featureName;
  cmStateSnapshot snp;
  string local_80;
  undefined1 local_60 [40];
  cmStateSnapshot local_38;
  
  std::__cxx11::string::string((string *)&local_80,(string *)feature);
  if (config->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_80);
    cmsys::SystemTools::UpperCase((string *)local_60,config);
    std::__cxx11::string::append((string *)&local_80);
    std::__cxx11::string::~string((string *)local_60);
  }
  local_38.Position.Position = (this->StateSnapshot).Position.Position;
  local_38.State = (this->StateSnapshot).State;
  local_38.Position.Tree = (this->StateSnapshot).Position.Tree;
  while (bVar1 = cmStateSnapshot::IsValid(&local_38), pcVar2 = (char *)0x0, bVar1) {
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_60,&local_38);
    pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_60,&local_80);
    if (pcVar2 != (char *)0x0) break;
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_60,&local_38);
    local_38.Position.Position = local_60._16_8_;
    local_38.State = (cmState *)local_60._0_8_;
    local_38.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_60._8_8_;
  }
  std::__cxx11::string::~string((string *)&local_80);
  return pcVar2;
}

Assistant:

const char* cmLocalGenerator::GetFeature(const std::string& feature,
                                         const std::string& config)
{
  std::string featureName = feature;
  // TODO: Define accumulation policy for features (prepend, append, replace).
  // Currently we always replace.
  if (!config.empty()) {
    featureName += "_";
    featureName += cmSystemTools::UpperCase(config);
  }
  cmStateSnapshot snp = this->StateSnapshot;
  while (snp.IsValid()) {
    if (const char* value = snp.GetDirectory().GetProperty(featureName)) {
      return value;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return nullptr;
}